

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O3

void __thiscall duckdb::MetaTransaction::ModifyDatabase(MetaTransaction *this,AttachedDatabase *db)

{
  AttachedDatabase *pAVar1;
  pointer pcVar2;
  bool bVar3;
  Transaction *pTVar4;
  TransactionException *pTVar5;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar3 = AttachedDatabase::IsSystem(db);
  if (!bVar3) {
    bVar3 = AttachedDatabase::IsTemporary(db);
    if (!bVar3) {
      if (this->is_read_only == true) {
        pTVar5 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "Cannot write to database \"%s\" - transaction is launched in read-only mode","")
        ;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (db->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,
                   pcVar2 + (db->super_CatalogEntry).name._M_string_length);
        TransactionException::TransactionException<std::__cxx11::string>(pTVar5,&local_b0,&local_50)
        ;
        __cxa_throw(pTVar5,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pAVar1 = (this->modified_database).ptr;
      if (pAVar1 == (AttachedDatabase *)0x0) {
        (this->modified_database).ptr = db;
        pTVar4 = GetTransaction(this,db);
        (*pTVar4->_vptr_Transaction[2])(pTVar4);
        return;
      }
      if (pAVar1 != db) {
        pTVar5 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "Attempting to write to database \"%s\" in a transaction that has already modified database \"%s\" - a single transaction can only write to a single attached database."
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (db->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,
                   pcVar2 + (db->super_CatalogEntry).name._M_string_length);
        optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&this->modified_database);
        pAVar1 = (this->modified_database).ptr;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = (pAVar1->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,
                   pcVar2 + (pAVar1->super_CatalogEntry).name._M_string_length);
        TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
                  (pTVar5,&local_b0,&local_70,&local_90);
        __cxa_throw(pTVar5,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void MetaTransaction::ModifyDatabase(AttachedDatabase &db) {
	if (db.IsSystem() || db.IsTemporary()) {
		// we can always modify the system and temp databases
		return;
	}
	if (IsReadOnly()) {
		throw TransactionException("Cannot write to database \"%s\" - transaction is launched in read-only mode",
		                           db.GetName());
	}
	if (!modified_database) {
		modified_database = &db;

		auto &transaction = GetTransaction(db);
		transaction.SetReadWrite();
		return;
	}
	if (&db != modified_database.get()) {
		throw TransactionException(
		    "Attempting to write to database \"%s\" in a transaction that has already modified database \"%s\" - a "
		    "single transaction can only write to a single attached database.",
		    db.GetName(), modified_database->GetName());
	}
}